

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O0

void * qc_list_pophead(QcList *list)

{
  QcListEntry *__ptr;
  void *pop_data;
  QcListEntry *pop_entry;
  QcList *list_local;
  
  if (list != (QcList *)0x0) {
    if (list->head == (QcListEntry *)0x0) {
      list_local = (QcList *)0x0;
    }
    else {
      __ptr = list->head;
      if (list->cur == list->head) {
        list->cur = list->head->next;
      }
      list->head = list->head->next;
      if (list->head != (QcListEntry *)0x0) {
        list->head->prev = (QcListEntry *)0x0;
      }
      list->count = list->count - 1;
      if (list->count == 0) {
        list->tail = (QcListEntry *)0x0;
      }
      list_local = (QcList *)__ptr->data;
      free(__ptr);
    }
    return list_local;
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
          ,0x24e);
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                ,0x24e,"void *qc_list_pophead(QcList *)");
}

Assistant:

void* qc_list_pophead(QcList *list)
{
	QcListEntry	*pop_entry;
	void *pop_data;

    qc_assert(list);

    if(NULL == list->head)
    {
		return NULL;
    }

    pop_entry = list->head;

    if(list->cur == list->head)
    {
        list->cur = list->head->next;
    }

    list->head = list->head->next;
    if(NULL != list->head)
    {
        list->head->prev = NULL;
    }
	
    list->count--;

    if(0 == list->count){
		list->tail = NULL;
	}
    
    pop_data = pop_entry->data;
    qc_free(pop_entry);

    return pop_data;
}